

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O1

void slang::ast::addSubroutineDrivers(Symbol *procedure,SubroutineSymbol *sub,Expression *callExpr)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  Statement *this;
  ulong uVar4;
  long lVar5;
  ulong hash;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 auVar12 [16];
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  visitedSubs;
  DriverVisitor visitor;
  StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL> local_160;
  Symbol *local_158;
  Expression *local_150;
  undefined1 local_148 [40];
  Symbol *local_120;
  undefined8 local_118;
  long local_110;
  undefined1 *local_108;
  SubroutineSymbol **ppSStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [112];
  undefined8 local_78;
  long local_70;
  undefined1 *local_68;
  ValueSymbol **ppVStack_60;
  undefined8 local_58;
  undefined8 local_50;
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  *local_48;
  
  local_148._32_8_ = local_148;
  local_118 = 0x3f;
  local_110 = 1;
  ppSStack_100 = (SubroutineSymbol **)0x0;
  local_108 = &boost::unordered::detail::foa::
               dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
               ::storage;
  local_f8 = 0;
  local_f0 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sub;
  hash = SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar4 = hash >> 0x3f;
  uVar1 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  uVar7 = 0;
  do {
    lVar5 = uVar4 * 0x10;
    cVar8 = (char)uVar1;
    auVar12[0] = -((&boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage)[lVar5] == cVar8);
    cVar9 = (char)((uint)uVar1 >> 8);
    auVar12[1] = -((&DAT_0049b461)[lVar5] == cVar9);
    cVar10 = (char)((uint)uVar1 >> 0x10);
    auVar12[2] = -((&DAT_0049b462)[lVar5] == cVar10);
    cVar11 = (char)((uint)uVar1 >> 0x18);
    auVar12[3] = -((&DAT_0049b463)[lVar5] == cVar11);
    auVar12[4] = -((&DAT_0049b464)[lVar5] == cVar8);
    auVar12[5] = -((&DAT_0049b465)[lVar5] == cVar9);
    auVar12[6] = -((&UNK_0049b466)[lVar5] == cVar10);
    auVar12[7] = -((&UNK_0049b467)[lVar5] == cVar11);
    auVar12[8] = -((&UNK_0049b468)[lVar5] == cVar8);
    auVar12[9] = -((&UNK_0049b469)[lVar5] == cVar9);
    auVar12[10] = -((&UNK_0049b46a)[lVar5] == cVar10);
    auVar12[0xb] = -((&UNK_0049b46b)[lVar5] == cVar11);
    auVar12[0xc] = -((&UNK_0049b46c)[lVar5] == cVar8);
    auVar12[0xd] = -((&UNK_0049b46d)[lVar5] == cVar9);
    auVar12[0xe] = -((&UNK_0049b46e)[lVar5] == cVar10);
    auVar12[0xf] = -((&DAT_0049b46f)[lVar5] == cVar11);
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
    local_158 = procedure;
    local_150 = callExpr;
    local_120 = (Symbol *)local_148._32_8_;
    if (uVar6 != 0) {
      do {
        uVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        if (*(SubroutineSymbol **)(uVar4 * 0x78 + (ulong)uVar2 * 8) == sub) {
          local_160.storage = (Storage *)sub;
          if (uVar4 * 0x78 + (ulong)uVar2 * 8 == 0) goto LAB_0042e98b;
          goto LAB_0042e875;
        }
        uVar6 = uVar6 - 1 & uVar6;
      } while (uVar6 != 0);
    }
    if (((&DAT_0049b46f)[lVar5] &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    uVar7 = uVar7 + 1;
    uVar4 = (ulong)((int)uVar4 + (int)uVar7 & 1);
  } while (uVar7 < 2);
LAB_0042e98b:
  local_160.storage = (Storage *)sub;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
  ::unchecked_emplace_with_rehash<slang::ast::SubroutineSymbol_const*>
            ((locator *)local_e8,
             (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
              *)&local_120,hash,(SubroutineSymbol **)&local_160);
LAB_0042e875:
  local_e8._96_8_ = local_e8 + 0x20;
  local_e8._0_8_ = local_158;
  local_e8._16_8_ = local_150;
  local_78 = 0x3f;
  local_70 = 1;
  local_68 = &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  ppVStack_60 = (ValueSymbol **)0x0;
  local_58 = 0;
  local_50 = 0;
  local_48 = (SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
              *)local_148;
  local_e8._8_8_ = sub;
  local_e8._104_8_ = local_e8._96_8_;
  this = SubroutineSymbol::getBody(sub);
  Statement::visit<slang::ast::DriverVisitor&>(this,(DriverVisitor *)local_e8);
  local_160.storage = (Storage *)local_e8._104_8_;
  if (ppVStack_60 != (ValueSymbol **)0x0) {
    slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>::deallocate
              (&local_160,ppVStack_60,local_70 * 0x88 + 0x96U >> 3);
  }
  local_e8._0_8_ = local_120;
  if (ppSStack_100 != (SubroutineSymbol **)0x0) {
    slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>::
    deallocate((StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL> *)local_e8,
               ppSStack_100,local_110 * 0x88 + 0x96U >> 3);
  }
  return;
}

Assistant:

static void addSubroutineDrivers(const Symbol& procedure, const SubroutineSymbol& sub,
                                 const Expression& callExpr) {
    SmallSet<const SubroutineSymbol*, 4> visitedSubs;
    visitedSubs.emplace(&sub);

    DriverVisitor visitor(procedure, visitedSubs, sub, callExpr);
    sub.getBody().visit(visitor);
}